

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

int IsValidExtendedFormat(WebPDemuxer *dmux)

{
  int *piVar1;
  WebPDemuxState WVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Frame *pFVar8;
  int iVar9;
  
  WVar2 = dmux->state;
  iVar7 = 1;
  if (WVar2 != WEBP_DEMUX_PARSING_HEADER) {
    iVar7 = dmux->canvas_width;
    if (((0 < iVar7) && (iVar3 = dmux->canvas_height, 0 < iVar3)) && (-1 < dmux->loop_count)) {
      uVar4 = dmux->feature_flags;
      pFVar8 = dmux->frames;
      if ((uVar4 & 0xffffffc1) == 0 && (pFVar8 != (Frame *)0x0 || WVar2 != WEBP_DEMUX_DONE)) {
        if (pFVar8 == (Frame *)0x0) {
          return 1;
        }
        do {
          piVar1 = &pFVar8->frame_num;
          while (pFVar8->frame_num == *piVar1) {
            if (1 < *piVar1 && (uVar4 & 2) == 0) {
              return 0;
            }
            if (pFVar8->complete == 0) {
              if (WVar2 == WEBP_DEMUX_DONE) {
                return 0;
              }
              if (((pFVar8->img_components[1].size != 0) && (pFVar8->img_components[0].size != 0))
                 && (pFVar8->img_components[0].offset < pFVar8->img_components[1].offset)) {
                return 0;
              }
              if (pFVar8->next != (Frame *)0x0) {
                return 0;
              }
              iVar9 = pFVar8->width;
              if (0 < iVar9) goto LAB_00150607;
            }
            else {
              if (pFVar8->img_components[1].size == 0) {
                if (pFVar8->img_components[0].size == 0) {
                  return 0;
                }
              }
              else if (pFVar8->img_components[0].offset < pFVar8->img_components[1].offset) {
                return 0;
              }
              iVar9 = pFVar8->width;
              if (iVar9 < 1) {
                return 0;
              }
              if (pFVar8->height < 1) {
                return 0;
              }
LAB_00150607:
              iVar5 = pFVar8->height;
              if (0 < iVar5) {
                iVar6 = pFVar8->x_offset;
                if ((uVar4 & 2) == 0) {
                  if (((iVar6 != 0) || (iVar5 != iVar3)) ||
                     ((iVar9 != iVar7 || (pFVar8->y_offset != 0)))) {
                    return 0;
                  }
                }
                else {
                  if (iVar6 < 0) {
                    return 0;
                  }
                  if (pFVar8->y_offset < 0) {
                    return 0;
                  }
                  if (iVar7 < iVar6 + iVar9) {
                    return 0;
                  }
                  if (iVar3 < pFVar8->y_offset + iVar5) {
                    return 0;
                  }
                }
              }
            }
            pFVar8 = pFVar8->next;
            if (pFVar8 == (Frame *)0x0) {
              return 1;
            }
          }
        } while( true );
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int IsValidExtendedFormat(const WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags & ANIMATION_FLAG);
  const Frame* f = dmux->frames;

  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width <= 0 || dmux->canvas_height <= 0) return 0;
  if (dmux->loop_count < 0) return 0;
  if (dmux->state == WEBP_DEMUX_DONE && dmux->frames == NULL) return 0;
  if (dmux->feature_flags & ~ALL_VALID_FLAGS) return 0;  // invalid bitstream

  while (f != NULL) {
    const int cur_frame_set = f->frame_num;

    // Check frame properties.
    for (; f != NULL && f->frame_num == cur_frame_set; f = f->next) {
      const ChunkData* const image = f->img_components;
      const ChunkData* const alpha = f->img_components + 1;

      if (!is_animation && f->frame_num > 1) return 0;

      if (f->complete) {
        if (alpha->size == 0 && image->size == 0) return 0;
        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && alpha->offset > image->offset) {
          return 0;
        }

        if (f->width <= 0 || f->height <= 0) return 0;
      } else {
        // There shouldn't be a partial frame in a complete file.
        if (dmux->state == WEBP_DEMUX_DONE) return 0;

        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && image->size > 0 &&
            alpha->offset > image->offset) {
          return 0;
        }
        // There shouldn't be any frames after an incomplete one.
        if (f->next != NULL) return 0;
      }

      if (f->width > 0 && f->height > 0 &&
          !CheckFrameBounds(f, !is_animation,
                            dmux->canvas_width, dmux->canvas_height)) {
        return 0;
      }
    }
  }
  return 1;
}